

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O3

int ffgtcs(fitsfile *fptr,int xcol,int ycol,double *xrval,double *yrval,double *xrpix,double *yrpix,
          double *xinc,double *yinc,double *rot,char *type,int *status)

{
  int iVar1;
  fitsfile *tptr;
  double *local_60;
  double *local_58;
  int colnum [2];
  long naxes [2];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    naxes[0] = 10;
    naxes[1] = 10;
    local_60 = yrval;
    local_58 = xrpix;
    colnum[0] = xcol;
    colnum[1] = ycol;
    ffinit(&tptr,"mem://",status);
    ffcrim(tptr,0x20,2,naxes,status);
    fits_copy_pixlist2image(fptr,tptr,9,2,colnum,status);
    fits_write_keys_histo(fptr,tptr,2,colnum,status);
    iVar1 = *status;
    if (iVar1 < 1) {
      ffgics(tptr,xrval,local_60,local_58,yrpix,xinc,yinc,rot,type,status);
      if (*status < 1) {
        ffdelt(tptr,status);
        iVar1 = *status;
      }
      else {
        ffpmsg("ffgtcs could not find all the celestial coordinate keywords");
        *status = 0x1f9;
        iVar1 = 0x1f9;
      }
    }
  }
  return iVar1;
}

Assistant:

int ffgtcs(fitsfile *fptr,    /* I - FITS file pointer           */
           int xcol,          /* I - column containing the RA coordinate  */
           int ycol,          /* I - column containing the DEC coordinate */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-sin') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords
       from a FITS table where the X and Y or RA and DEC coordinates
       are stored in separate column.  Do this by converting the
       table to a temporary FITS image, then reading the keywords
       from the image file.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)
*/
{
    int colnum[2];
    long naxes[2];
    fitsfile *tptr;

    if (*status > 0)
       return(*status);

    colnum[0] = xcol;
    colnum[1] = ycol;
    naxes[0] = 10;
    naxes[1] = 10;

    /* create temporary  FITS file, in memory */
    ffinit(&tptr, "mem://", status);
    
    /* create a temporary image; the datatype and size are not important */
    ffcrim(tptr, 32, 2, naxes, status);
    
    /* now copy the relevant keywords from the table to the image */
    fits_copy_pixlist2image(fptr, tptr, 9, 2, colnum, status);

    /* write default WCS keywords, if they are not present */
    fits_write_keys_histo(fptr, tptr, 2, colnum, status);

    if (*status > 0)
       return(*status);
         
    /* read the WCS keyword values from the temporary image */
    ffgics(tptr, xrval, yrval, xrpix, yrpix, xinc, yinc, rot, type, status); 

    if (*status > 0)
    {
      ffpmsg
      ("ffgtcs could not find all the celestial coordinate keywords");
      return(*status = NO_WCS_KEY); 
    }

    /* delete the temporary file */
    fits_delete_file(tptr, status);
    
    return(*status);
}